

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryMaterialsLoader15.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::LibraryMaterialsLoader15::begin__instance_effect(LibraryMaterialsLoader15 *this)

{
  instance_effect__AttributeData *in_stack_00000128;
  LibraryMaterialsLoader15 *in_stack_00000130;
  
  begin__instance_effect(in_stack_00000130,in_stack_00000128);
  return;
}

Assistant:

bool LibraryMaterialsLoader15::begin__instance_effect( const COLLADASaxFWL15::instance_effect__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__instance_effect(attributeData));
COLLADASaxFWL::instance_effect__AttributeData attrData;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL15::instance_effect__AttributeData::ATTRIBUTE_URL_PRESENT) == COLLADASaxFWL15::instance_effect__AttributeData::ATTRIBUTE_URL_PRESENT ) {
    attrData.url = attributeData.url;
    attrData.present_attributes |= COLLADASaxFWL::instance_effect__AttributeData::ATTRIBUTE_URL_PRESENT;
}
return mLoader->begin__instance_effect(attrData);
}